

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O3

bool __thiscall
Clasp::ClaspBerkmin::bump(ClaspBerkmin *this,Solver *s,WeightLitVec *lits,double adj)

{
  pointer ppVar1;
  uint32 uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(lits->ebo_).size;
  if (uVar5 != 0) {
    ppVar1 = (lits->ebo_).buf;
    lVar3 = 0;
    do {
      uVar4 = *(uint *)((long)&(ppVar1->first).rep_ + lVar3) >> 2;
      if (((this->order_).nant != true) ||
         ((uVar4 < (s->shared_->varInfo_).ebo_.size &&
          (((s->shared_->varInfo_).ebo_.buf[uVar4].rep & 0x20) != 0)))) {
        uVar2 = Order::decayedScore(&this->order_,uVar4);
        uVar4 = (int)((double)*(int *)((long)&ppVar1->second + lVar3) * adj) + uVar2;
        if (0xfffe < uVar4) {
          uVar4 = 0xffff;
        }
        (this->order_).score.ebo_.buf[*(uint *)((long)&(ppVar1->first).rep_ + lVar3) >> 2].act =
             (uint16)uVar4;
      }
      lVar3 = lVar3 + 8;
    } while (uVar5 << 3 != lVar3);
  }
  return true;
}

Assistant:

bool ClaspBerkmin::bump(const Solver& s, const WeightLitVec& lits, double adj) {
	for (WeightLitVec::const_iterator it = lits.begin(), end = lits.end(); it != end; ++it) {
		if (!order_.nant || s.varInfo(it->first.var()).nant()) {
			uint32 xf = order_.decayedScore(it->first.var()) + static_cast<weight_t>(it->second*adj);
			order_.score[it->first.var()].act = (uint16)std::min(xf, UINT32_MAX>>16);
		}
	}
	return true;
}